

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O1

bool trt_pose::parse::munkresStep3
               (float *cost_graph,int M,PairGraph *star_graph,PairGraph *prime_graph,
               CoverTable *cover_table,pair<int,_int> *p,int nrows,int ncols)

{
  ulong *puVar1;
  int iVar2;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  ulong uVar13;
  bool local_62;
  
  local_62 = 0 < nrows;
  if (0 < nrows) {
    uVar11 = 0;
    do {
      if (0 < ncols) {
        p_Var3 = (cover_table->rows).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        p_Var4 = (cover_table->cols).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar10 = 1L << ((byte)uVar11 & 0x3f);
        piVar5 = (prime_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (prime_graph->cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (star_graph->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = 0;
        bVar12 = 0 < ncols;
        do {
          if ((((cost_graph[uVar13] == 0.0) && (!NAN(cost_graph[uVar13]))) &&
              (uVar8 = p_Var3[uVar11 >> 6], (uVar8 & uVar10) == 0)) &&
             ((p_Var4[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0)) {
            piVar5[uVar11] = (int)uVar13;
            piVar6[uVar13] = (int)uVar11;
            iVar2 = piVar7[uVar11];
            if ((long)iVar2 < 0) {
              p->first = (int)uVar11;
              p->second = (int)uVar13;
              if (bVar12) {
                return local_62;
              }
              break;
            }
            p_Var3[uVar11 >> 6] = uVar8 | uVar10;
            bVar9 = (byte)iVar2 & 0x3f;
            puVar1 = p_Var4 + ((ulong)(long)iVar2 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
          }
          uVar13 = uVar13 + 1;
          bVar12 = (long)uVar13 < (long)ncols;
        } while ((uint)ncols != uVar13);
      }
      uVar11 = uVar11 + 1;
      local_62 = uVar11 < (uint)nrows;
      cost_graph = cost_graph + M;
    } while (uVar11 != (uint)nrows);
  }
  return local_62;
}

Assistant:

bool munkresStep3(const float *cost_graph, const int M,
                  const PairGraph &star_graph, PairGraph &prime_graph,
                  CoverTable &cover_table, std::pair<int, int> &p,
                  const int nrows, const int ncols) {
  for (int i = 0; i < nrows; i++) {
    for (int j = 0; j < ncols; j++) {
      if (cost_graph[i * M + j] == 0 && !cover_table.isCovered(i, j)) {
        prime_graph.set(i, j);
        if (star_graph.isRowSet(i)) {
          cover_table.coverRow(i);
          cover_table.uncoverCol(star_graph.colForRow(i));
        } else {
          p.first = i;
          p.second = j;
          return 1;
        }
      }
    }
  }
  return 0;
}